

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> * read_file_text(string *file_name)

{
  int iVar1;
  FILE *f;
  string *in_RSI;
  string *in_RDI;
  uint32_t num;
  FILE *fd;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *content;
  string *file_name_00;
  undefined1 local_50 [16];
  string local_40 [32];
  FILE *local_20;
  undefined1 local_11;
  
  local_11 = 0;
  file_name_00 = in_RDI;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x17e2fa);
  std::__cxx11::string::string(local_40,in_RSI);
  f = fopen_or_fail(file_name_00,(char *)in_RDI);
  std::__cxx11::string::~string(local_40);
  local_20 = f;
  while (iVar1 = __isoc99_fscanf(local_20,"%u\n",local_50), iVar1 == 1) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)file_name_00,
               (value_type *)in_RDI);
  }
  fclose_or_fail(f);
  return (vector<unsigned_int,_std::allocator<unsigned_int>_> *)file_name_00;
}

Assistant:

std::vector<uint32_t> read_file_text(std::string file_name)
{
    std::vector<uint32_t> content;
    auto fd = fopen_or_fail(file_name, "r");
    uint32_t num;
    while (fscanf(fd, "%u\n", &num) == 1) {
        content.push_back(num);
    }
    fclose_or_fail(fd);
    return content;
}